

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.c
# Opt level: O3

void render_task(parallel_task_2d *task,size_t thread_id)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  double *pdVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int i;
  int iVar10;
  int m;
  uint uVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  
  iVar10 = (int)task->range[1].begin;
  iVar1 = (int)task->range[1].end;
  if (iVar10 < iVar1) {
    iVar2 = (int)task->range[0].begin;
    iVar3 = (int)task->range[0].end;
    pdVar5 = (double *)task[1].work_item.work_fn;
    do {
      if (iVar2 < iVar3) {
        iVar13 = iVar2;
        do {
          uVar8 = *(ulong *)((long)pdVar5 + 0x24);
          uVar4 = *(uint *)(pdVar5 + 4);
          uVar9 = 0xff0000;
          uVar7 = 0xff;
          if (0 < (int)uVar4) {
            iVar6 = (int)(uVar8 >> 0x20);
            auVar16._0_8_ =
                 (double)((int)uVar8 - iVar13) * *pdVar5 + pdVar5[1] * (double)(iVar13 + -1);
            auVar16._8_8_ = (double)(iVar6 - iVar10) * pdVar5[2] + pdVar5[3] * (double)(iVar10 + -1)
            ;
            auVar17._0_8_ = (double)((int)uVar8 + -1);
            auVar17._8_8_ = (double)(iVar6 + -1);
            auVar16 = divpd(auVar16,auVar17);
            dVar15 = auVar16._0_8_;
            dVar19 = auVar16._8_8_;
            uVar11 = 1;
            do {
              dVar18 = (dVar15 * dVar15 - dVar19 * dVar19) + auVar16._0_8_;
              uVar12 = uVar11;
              if ((2.0 < ABS(dVar18)) ||
                 (dVar19 = (dVar15 + dVar15) * dVar19 + auVar16._8_8_, 2.0 < ABS(dVar19))) break;
              bVar14 = uVar11 != uVar4;
              dVar15 = dVar18;
              uVar11 = uVar11 + 1;
              uVar12 = uVar4 + 1;
            } while (bVar14);
            if ((uVar12 & 1) == 0) {
              dVar15 = pow((double)(int)uVar12 / (double)(int)uVar4,0.125);
              uVar9 = (int)(dVar15 * 255.0) & 0xff;
              uVar7 = uVar9 * 0x999c >> 0x10;
              uVar9 = uVar9 << 0x10;
              uVar8 = (ulong)*(uint *)((long)pdVar5 + 0x24);
            }
          }
          *(uint *)((long)pdVar5[6] + (long)((int)uVar8 * iVar10 + iVar13) * 4) =
               uVar7 << 8 | uVar9 | uVar7;
          iVar13 = iVar13 + 1;
        } while (iVar13 != iVar3);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar1);
  }
  return;
}

Assistant:

static void render_task(struct parallel_task_2d* task, size_t thread_id) {
    IGNORE(thread_id);
    struct render_task* render_task = (void*)task;
    struct tile tile = {
        .i = render_task->task.range[1].begin,
        .j = render_task->task.range[0].begin,
        .m = render_task->task.range[1].end,
        .n = render_task->task.range[0].end
    };
    render_tile(&tile, render_task->global_data);
}